

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O2

void __thiscall InstructionGenerator::genCloneTop(InstructionGenerator *this,string *varName)

{
  Compiler *this_00;
  bool bVar1;
  uint stackPos;
  int iVar2;
  Variable *pVVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  uint a;
  uint uVar4;
  allocator local_101;
  string local_100;
  string arrayName;
  string arrayIndex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)varName);
  stackPos = VirtualStack::isVariable(&this->super_VirtualStack,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (-1 < (int)stackPos) {
    bVar1 = Parser::isArrayDefinition(&this->parser,varName);
    if (bVar1) {
      arrayName._M_dataplus._M_p = (pointer)&arrayName.field_2;
      arrayName._M_string_length = 0;
      arrayName.field_2._M_local_buf[0] = '\0';
      arrayIndex._M_dataplus._M_p = (pointer)&arrayIndex.field_2;
      arrayIndex._M_string_length = 0;
      arrayIndex.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string((string *)&local_60,(string *)varName);
      Parser::splitArrayDefinition(&this->parser,&local_60,&arrayName,&arrayIndex);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::string((string *)&local_100,"",&local_101);
      std::__cxx11::string::string((string *)&local_80,(string *)&arrayName);
      iVar2 = VirtualStack::isVariable(&this->super_VirtualStack,&local_80);
      genCreateInt(this,&local_100,iVar2 + 1);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_100);
      this_00 = this->compiler;
      std::operator+(&local_100,"(",&arrayIndex);
      std::operator+(&local_a0,&local_100,")");
      Compiler::evaluateBracket(this_00,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_100);
      genMathSubtract(this,2);
      genDynamicCloneTop(this);
      std::__cxx11::string::~string((string *)&arrayIndex);
      std::__cxx11::string::~string((string *)&arrayName);
    }
    else {
      pVVar3 = VirtualStack::getVariable(&this->super_VirtualStack,stackPos);
      if (pVVar3->isArray == true) {
        for (uVar4 = 0; uVar4 < pVVar3->arrayLength; uVar4 = uVar4 + 1) {
          genCloneTop(this,stackPos);
        }
      }
      else {
        genCloneTop(this,stackPos);
      }
    }
    return;
  }
  __return_storage_ptr__ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       __cxa_allocate_exception(0x20);
  std::operator+(&arrayName,"Undefined variable \'",varName);
  std::operator+(__return_storage_ptr__,&arrayName,"\'");
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void InstructionGenerator::genCloneTop(const std::string &varName)
{
    int varPos = isVariable(varName);
    if(varPos < 0)
        throw std::string("Undefined variable '" + varName + "'");
    else
    {
        if(parser.isArrayDefinition(varName)) //Check if the variable is an array to calculate element offset
        {
            //Split array definition into name and size
            std::string arrayName;
            std::string arrayIndex;
            parser.splitArrayDefinition(varName, arrayName, arrayIndex);

            //Push array base position to stack
            genCreateInt("", static_cast<unsigned int>(isVariable(arrayName)+1));

            //Push index value to stack
            compiler->evaluateBracket("(" + arrayIndex + ")");

            //Subtract them to calculate offset
            genMathSubtract(2);

            //Dynamic clone top the calculated offset to the top
            genDynamicCloneTop();
        }
        else //Else if not an array element
        {
            //Check if we're moving a whole array
            Variable &var = getVariable(varPos);
            if(var.isArray) //We're moving a whole array
            {
                for(unsigned int a = 0; a < var.arrayLength; a++)
                {
                    genCloneTop(varPos); //We can keep using varPos repeatedly as the offset of the next variable is changed by pushing more things to the stack
                }
            }
            else //We're moving a single variable
            {
                genCloneTop(varPos);
            }
        }
    }
}